

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitStructGet(BinaryInstWriter *this,StructGet *curr)

{
  bool bVar1;
  bool bVar2;
  Struct *this_00;
  BufferWithRandomAccess *pBVar3;
  U32LEB local_4c;
  uintptr_t local_48;
  U32LEB local_40;
  undefined4 local_3c;
  BasicType local_38;
  ASTNodes prefix;
  int8_t op;
  const_reference pvStack_30;
  bool atomic;
  value_type *field;
  HeapType *local_20;
  HeapType *heapType;
  StructGet *curr_local;
  BinaryInstWriter *this_local;
  
  heapType = (HeapType *)curr;
  curr_local = (StructGet *)this;
  bVar1 = wasm::Type::isNull(&curr->ref->type);
  if (bVar1) {
    emitUnreachable(this);
  }
  else {
    field = (value_type *)wasm::Type::getHeapType((Type *)(heapType[3].id + 8));
    local_20 = (HeapType *)&field;
    this_00 = HeapType::getStruct(local_20);
    pvStack_30 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                           (&this_00->fields,(ulong)(uint)heapType[2].id);
    prefix._3_1_ = *(int *)((long)&heapType[4].id + 4) != 0;
    local_38 = i32;
    bVar2 = wasm::Type::operator!=(&pvStack_30->type,&local_38);
    bVar1 = true;
    if (!bVar2) {
      bVar1 = pvStack_30->packedType == not_packed;
    }
    if (bVar1) {
      prefix._2_1_ = 2;
      if ((prefix._3_1_ & 1) != AtomicNotify >> 0x18) {
        prefix._2_1_ = 0x5c;
      }
    }
    else if ((heapType[4].id & 1) == 0) {
      prefix._2_1_ = 4;
      if ((prefix._3_1_ & 1) != AtomicNotify >> 0x18) {
        prefix._2_1_ = 0x5e;
      }
    }
    else {
      prefix._2_1_ = 3;
      if ((prefix._3_1_ & 1) != AtomicNotify >> 0x18) {
        prefix._2_1_ = 0x5d;
      }
    }
    local_3c = 0xfb;
    if ((prefix._3_1_ & 1) != AtomicNotify >> 0x18) {
      local_3c = 0xfe;
    }
    pBVar3 = BufferWithRandomAccess::operator<<(this->o,(int8_t)local_3c);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_40,(int)(char)prefix._2_1_);
    BufferWithRandomAccess::operator<<(pBVar3,local_40);
    if ((prefix._3_1_ & 1) != AtomicNotify >> 0x18) {
      WasmBinaryWriter::writeMemoryOrder
                (this->parent,*(MemoryOrder *)((long)&heapType[4].id + 4),false);
    }
    local_48 = local_20->id;
    WasmBinaryWriter::writeIndexedHeapType(this->parent,(HeapType)local_48);
    pBVar3 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_4c,(uint)heapType[2].id);
    BufferWithRandomAccess::operator<<(pBVar3,local_4c);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitStructGet(StructGet* curr) {
  if (curr->ref->type.isNull()) {
    emitUnreachable();
    return;
  }
  const auto& heapType = curr->ref->type.getHeapType();
  const auto& field = heapType.getStruct().fields[curr->index];
  bool atomic = curr->order != MemoryOrder::Unordered;
  int8_t op;
  if (field.type != Type::i32 || field.packedType == Field::not_packed) {
    op = atomic ? BinaryConsts::StructAtomicGet : BinaryConsts::StructGet;
  } else if (curr->signed_) {
    op = atomic ? BinaryConsts::StructAtomicGetS : BinaryConsts::StructGetS;
  } else {
    op = atomic ? BinaryConsts::StructAtomicGetU : BinaryConsts::StructGetU;
  }
  auto prefix = atomic ? BinaryConsts::AtomicPrefix : BinaryConsts::GCPrefix;
  o << int8_t(prefix) << U32LEB(op);
  if (atomic) {
    parent.writeMemoryOrder(curr->order);
  }
  parent.writeIndexedHeapType(heapType);
  o << U32LEB(curr->index);
}